

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# texture.cpp
# Opt level: O0

void __thiscall rw::TexDictionary::streamWrite(TexDictionary *this,Stream *stream)

{
  Texture *pTVar1;
  uint32 uVar2;
  int32 iVar3;
  int iVar4;
  Texture *pTVar5;
  uint32 sz;
  Texture *tex;
  LLLink *lnk;
  LLLink *_next;
  int32 numTex;
  Stream *stream_local;
  TexDictionary *this_local;
  
  uVar2 = streamGetSize(this);
  writeChunkHeader(stream,0x16,uVar2);
  writeChunkHeader(stream,1,4);
  iVar3 = count(this);
  Stream::writeI16(stream,(int16)iVar3);
  Stream::writeI16(stream,0);
  tex = (Texture *)(this->textures).link.next;
  while( true ) {
    pTVar1 = (Texture *)tex->raster;
    pTVar5 = (Texture *)LinkList::end(&this->textures);
    if (tex == pTVar5) break;
    pTVar5 = Texture::fromDict((LLLink *)tex);
    uVar2 = Texture::streamGetSizeNative(pTVar5);
    iVar4 = PluginList::streamGetSize((PluginList *)&Texture::s_plglist,pTVar5);
    writeChunkHeader(stream,0x15,iVar4 + 0xc + uVar2);
    Texture::streamWriteNative(pTVar5,stream);
    PluginList::streamWrite((PluginList *)&Texture::s_plglist,stream,pTVar5);
    tex = pTVar1;
  }
  PluginList::streamWrite((PluginList *)&s_plglist,stream,this);
  return;
}

Assistant:

void
TexDictionary::streamWrite(Stream *stream)
{
	writeChunkHeader(stream, ID_TEXDICTIONARY, this->streamGetSize());
	writeChunkHeader(stream, ID_STRUCT, 4);
	int32 numTex = this->count();
	stream->writeI16(numTex);
	stream->writeI16(0);
	FORLIST(lnk, this->textures){
		Texture *tex = Texture::fromDict(lnk);
		uint32 sz = tex->streamGetSizeNative();
		sz += 12 + Texture::s_plglist.streamGetSize(tex);
		writeChunkHeader(stream, ID_TEXTURENATIVE, sz);
		tex->streamWriteNative(stream);
		Texture::s_plglist.streamWrite(stream, tex);
	}
	s_plglist.streamWrite(stream, this);
}